

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O0

void CreateInstallGenerator
               (cmMakefile *makefile,string *dest,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files)

{
  undefined8 __args_1;
  ulong uVar1;
  string *psVar2;
  undefined1 local_128 [23];
  undefined1 local_111;
  undefined1 local_110 [8];
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_108;
  bool local_fc [4];
  undefined1 local_f8 [4];
  MessageLevel message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_configurations;
  string local_d8;
  string local_b8 [8];
  string no_component;
  string local_90 [7];
  bool no_exclude_from_all;
  string no_rename;
  string no_permissions;
  undefined1 local_40 [8];
  string destination;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *dest_local;
  cmMakefile *makefile_local;
  
  destination.field_2._8_8_ = files;
  std::__cxx11::string::substr((ulong)local_40,(ulong)dest);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_40);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_40,".");
  }
  std::__cxx11::string::string((string *)(no_rename.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_90);
  no_component.field_2._M_local_buf[0xf] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"CMAKE_INSTALL_DEFAULT_COMPONENT_NAME",
             (allocator<char> *)
             ((long)&no_configurations.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  psVar2 = cmMakefile::GetSafeDefinition(makefile,&local_d8);
  std::__cxx11::string::string(local_b8,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&no_configurations.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_f8);
  local_fc = (bool  [4])cmInstallGenerator::SelectMessageLevel(makefile,false);
  __args_1 = destination.field_2._8_8_;
  local_111 = (_Alloc_hider)0x0;
  local_128[0x16] = 0;
  cmMakefile::GetBacktrace((cmMakefile *)local_128);
  std::
  make_unique<cmInstallFilesGenerator,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,bool,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,cmInstallGenerator::MessageLevel&,bool&,std::__cxx11::string_const&,bool,cmListFileBacktrace>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_110,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1,
             (bool *)local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_111,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&no_rename.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
             (MessageLevel *)local_b8,local_fc,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&no_component.field_2 + 0xf),(bool *)local_90,
             (cmListFileBacktrace *)(local_128 + 0x16));
  std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
  unique_ptr<cmInstallFilesGenerator,std::default_delete<cmInstallFilesGenerator>,void>
            ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)&local_108,
             (unique_ptr<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>_> *)
             local_110);
  cmMakefile::AddInstallGenerator(makefile,&local_108);
  std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::~unique_ptr
            (&local_108);
  std::unique_ptr<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>_>::
  ~unique_ptr((unique_ptr<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>_> *)
              local_110);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)(no_rename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

static void CreateInstallGenerator(cmMakefile& makefile,
                                   std::string const& dest,
                                   std::vector<std::string> const& files)
{
  // Construct the destination.  This command always installs under
  // the prefix.  We skip the leading slash given by the user.
  std::string destination = dest.substr(1);
  cmSystemTools::ConvertToUnixSlashes(destination);
  if (destination.empty()) {
    destination = ".";
  }

  // Use a file install generator.
  const std::string no_permissions;
  const std::string no_rename;
  bool no_exclude_from_all = false;
  std::string no_component =
    makefile.GetSafeDefinition("CMAKE_INSTALL_DEFAULT_COMPONENT_NAME");
  std::vector<std::string> no_configurations;
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(&makefile);
  makefile.AddInstallGenerator(cm::make_unique<cmInstallFilesGenerator>(
    files, destination, false, no_permissions, no_configurations, no_component,
    message, no_exclude_from_all, no_rename, false, makefile.GetBacktrace()));
}